

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O2

void __thiscall
jrtplib::RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::
~RTPHashTable(RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317> *this
             )

{
  ~RTPHashTable(this);
  operator_delete(this,0x10418);
  return;
}

Assistant:

~RTPHashTable()						{ Clear(); }